

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

QString * wrapText(QString *__return_storage_ptr__,QString *names,int optionNameMaxWidth,
                  QString *description)

{
  int iVar1;
  char16_t cVar2;
  long lVar3;
  char16_t *pcVar4;
  QArrayData *pQVar5;
  bool bVar6;
  CutResult CVar7;
  long n;
  qsizetype qVar8;
  QArrayData *pQVar9;
  int iVar10;
  char32_t cVar11;
  int iVar12;
  QArrayData *pQVar13;
  QArrayData *pQVar14;
  long in_FS_OFFSET;
  QString section;
  QString section_1;
  char16_t nl;
  QArrayData *local_f8;
  QString local_b8;
  QString local_98;
  QLatin1String local_78;
  char16_t local_62;
  QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_const_char16_t_&> local_60;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  local_62 = L'\n';
  local_78.m_size = 2;
  local_78.m_data = "  ";
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar3 = (description->d).size;
  n = (long)optionNameMaxWidth;
  if (lVar3 == 0) {
    iVar10 = 0;
  }
  else {
    pQVar14 = (QArrayData *)0xffffffffffffffff;
    pQVar9 = (QArrayData *)0x0;
    local_f8 = (QArrayData *)0x0;
    iVar12 = 0;
    iVar10 = 0;
    do {
      cVar2 = (description->d).ptr[(long)pQVar9];
      cVar11 = (char32_t)(ushort)cVar2;
      if ((((ushort)cVar2 - 9 < 5) || (cVar2 == L' ')) ||
         ((0x7f < (ushort)cVar2 &&
          (((cVar11 == L'\x85' || (cVar11 == L'\xa0')) ||
           (bVar6 = QChar::isSpace_helper(cVar11), bVar6)))))) {
        pQVar14 = pQVar9;
      }
      if ((iVar12 < 0x4c - optionNameMaxWidth) ||
         (pQVar13 = pQVar14, pQVar5 = pQVar14, pQVar14 == (QArrayData *)0xffffffffffffffff)) {
        iVar1 = iVar12 + 1;
        if (pQVar9 == (QArrayData *)(lVar3 + -1) ||
            pQVar14 == (QArrayData *)0xffffffffffffffff && 0x4b - optionNameMaxWidth <= iVar12) {
          pQVar13 = (QArrayData *)((long)&(pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1)
          ;
LAB_003d6cd3:
          pQVar5 = pQVar9;
          iVar12 = iVar1;
          if (pQVar13 != (QArrayData *)0xffffffffffffffff) goto LAB_003d6cdd;
        }
        else {
          pQVar13 = pQVar9;
          iVar12 = iVar1;
          if (cVar11 == L'\n') goto LAB_003d6cd3;
        }
      }
      else {
LAB_003d6cdd:
        pQVar9 = (QArrayData *)((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1);
        local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::mid(&local_b8,names,(long)iVar10,n);
        iVar10 = iVar10 + (int)local_b8.d.size;
        QString::leftJustified(&local_98,&local_b8,n,(QChar)0x20,false);
        local_60.a.b.d.size = local_98.d.size;
        local_60.a.b.d.ptr = local_98.d.ptr;
        local_60.a.b.d.d = local_98.d.d;
        local_98.d.size = 0;
        local_60.a.a = &local_78;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_60.b = (char16_t *)CONCAT62(local_60.b._2_6_,0x20);
        operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_char16_t> *)
                   &local_60);
        if (&(local_60.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_60.a.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_b8.d.d = (Data *)((long)pQVar13 - (long)local_f8);
        pcVar4 = (description->d).ptr;
        local_98.d.d = (Data *)local_f8;
        CVar7 = QtPrivate::QContainerImplHelper::mid
                          ((description->d).size,(qsizetype *)&local_98,(qsizetype *)&local_b8);
        if (CVar7 == Null) {
          local_60.a.a = (QLatin1String *)0x0;
          local_60.a.b.d.d = (Data *)0x0;
        }
        else {
          local_60.a.b.d.d = (Data *)(pcVar4 + (long)local_98.d.d);
          local_60.a.a = (QLatin1String *)local_b8.d.d;
        }
        local_60.a.b.d.ptr = &local_62;
        operator+=(__return_storage_ptr__,(QStringBuilder<QStringView,_const_char16_t_&> *)&local_60
                  );
        iVar12 = 0;
        pQVar14 = (QArrayData *)0xffffffffffffffff;
        local_f8 = pQVar9;
        if ((long)pQVar9 < lVar3) {
          cVar2 = (description->d).ptr[(long)pQVar9];
          if (((ushort)cVar2 - 9 < 5) || (cVar2 == L' ')) {
LAB_003d6e96:
            pQVar9 = (QArrayData *)
                     ((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 2);
            local_f8 = pQVar9;
          }
          else if (0x7f < (ushort)cVar2) {
            cVar11 = (char32_t)(ushort)cVar2;
            if ((cVar11 == L'\xa0') || (cVar11 == L'\x85')) goto LAB_003d6e96;
            bVar6 = QChar::isSpace_helper(cVar11);
            pQVar9 = (QArrayData *)
                     ((long)&(pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + (ulong)bVar6);
            local_f8 = pQVar9;
          }
        }
      }
      pQVar9 = (QArrayData *)((long)&(pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1);
    } while ((long)pQVar9 < lVar3);
  }
  qVar8 = (qsizetype)iVar10;
  if (qVar8 < (names->d).size) {
    do {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::mid(&local_98,names,qVar8,n);
      qVar8 = local_98.d.size;
      local_60.a.b.d.ptr = local_98.d.ptr;
      local_60.a.b.d.d = local_98.d.d;
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char16_t *)0x0;
      local_98.d.size = 0;
      local_60.a.b.d.size = qVar8;
      local_60.a.a = &local_78;
      local_60.b = &local_62;
      operator+=(__return_storage_ptr__,&local_60);
      if (&(local_60.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_60.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_60.a.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar10 = iVar10 + (int)qVar8;
      qVar8 = (qsizetype)iVar10;
    } while (qVar8 < (names->d).size);
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString wrapText(const QString &names, int optionNameMaxWidth, const QString &description)
{
    const auto nl = u'\n';
    const auto indentation = "  "_L1;

    // In case the list of option names is very long, wrap it as well
    int nameIndex = 0;
    auto nextNameSection = [&]() {
        QString section = names.mid(nameIndex, optionNameMaxWidth);
        nameIndex += section.size();
        return section;
    };

    QString text;
    qsizetype lineStart = 0;
    qsizetype lastBreakable = -1;
    const int max = 79 - (indentation.size() + optionNameMaxWidth + 1);
    int x = 0;
    const qsizetype len = description.size();

    for (qsizetype i = 0; i < len; ++i) {
        ++x;
        const QChar c = description.at(i);
        if (c.isSpace())
            lastBreakable = i;

        qsizetype breakAt = -1;
        qsizetype nextLineStart = -1;
        if (x > max && lastBreakable != -1) {
            // time to break and we know where
            breakAt = lastBreakable;
            nextLineStart = lastBreakable + 1;
        } else if ((x > max - 1 && lastBreakable == -1) || i == len - 1) {
            // time to break but found nowhere [-> break here], or end of last line
            breakAt = i + 1;
            nextLineStart = breakAt;
        } else if (c == nl) {
            // forced break
            breakAt = i;
            nextLineStart = i + 1;
        }

        if (breakAt != -1) {
            const qsizetype numChars = breakAt - lineStart;
            //qDebug() << "breakAt=" << description.at(breakAt) << "breakAtSpace=" << breakAtSpace << lineStart << "to" << breakAt << description.mid(lineStart, numChars);
            text += indentation + nextNameSection().leftJustified(optionNameMaxWidth) + u' ';
            text += QStringView{description}.mid(lineStart, numChars) + nl;
            x = 0;
            lastBreakable = -1;
            lineStart = nextLineStart;
            if (lineStart < len && description.at(lineStart).isSpace())
                ++lineStart; // don't start a line with a space
            i = lineStart;
        }
    }

    while (nameIndex < names.size()) {
        text += indentation + nextNameSection() + nl;
    }

    return text;
}